

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::format_uint<1u,char,fmt::v7::detail::buffer_appender<char>,unsigned__int128>
          (buffer_appender<char> out,unsigned___int128 value,int num_digits,bool upper)

{
  type tVar1;
  char *buffer;
  int in_ECX;
  undefined1 in_stack_ffffffffffffff48 [16];
  
  tVar1 = to_unsigned<int>(in_ECX);
  buffer = to_pointer<char>(out,(ulong)tVar1);
  if (buffer == (char *)0x0) {
    format_uint<1u,char,unsigned__int128>
              (&stack0xffffffffffffff48,(unsigned___int128)in_stack_ffffffffffffff48,num_digits,
               upper);
    out = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                    (&stack0xffffffffffffff48,&stack0xffffffffffffff48 + in_ECX,out);
  }
  else {
    format_uint<1u,char,unsigned__int128>
              (buffer,(unsigned___int128)in_stack_ffffffffffffff48,num_digits,upper);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}